

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  uchar value;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  Message m;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  
  Message::Message((Message *)&local_58);
  if (str->_M_string_length != 0) {
    uVar5 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar5];
      uVar4 = (uint)bVar1;
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          lVar2 = 6;
          if (is_attribute) {
            pcVar3 = "&quot;";
            goto LAB_00433498;
          }
          local_50._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_58.ptr_ + 0x10),(char *)&local_50,1);
        }
        else {
          if (bVar1 == 0x26) {
            lVar2 = 5;
            pcVar3 = "&amp;";
            goto LAB_00433498;
          }
LAB_004334af:
          if (('\x1f' < (char)bVar1) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
            if ((is_attribute) && ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_58.ptr_ + 0x10),"&#x",3);
              String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar4,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_58.ptr_ + 0x10),
                         (char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                          (byte)local_50._M_dataplus._M_p),local_50._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_58.ptr_ + 0x10),";",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(byte)local_50._M_dataplus._M_p) !=
                  &local_50.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                         (byte)local_50._M_dataplus._M_p),
                                local_50.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_50._M_dataplus._M_p._0_1_ = bVar1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_58.ptr_ + 0x10),(char *)&local_50,1);
            }
          }
        }
      }
      else {
        if (bVar1 == 0x27) {
          lVar2 = 6;
          if (!is_attribute) {
            local_50._M_dataplus._M_p._0_1_ = 0x27;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_58.ptr_ + 0x10),(char *)&local_50,1);
            goto LAB_0043349d;
          }
          pcVar3 = "&apos;";
        }
        else if (uVar4 == 0x3e) {
          lVar2 = 4;
          pcVar3 = "&gt;";
        }
        else {
          if (uVar4 != 0x3c) goto LAB_004334af;
          lVar2 = 4;
          pcVar3 = "&lt;";
        }
LAB_00433498:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_58.ptr_ + 0x10),pcVar3,lVar2);
      }
LAB_0043349d:
      uVar5 = uVar5 + 1;
    } while (uVar5 < str->_M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_58.ptr_);
  if (local_58.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_58.ptr_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}